

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionList.cpp
# Opt level: O0

void __thiscall curlpp::internal::OptionList::OptionList(OptionList *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__OptionList_00162d38;
  std::
  map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
  ::map((map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
         *)0x14f1a0);
  return;
}

Assistant:

OptionList::OptionList()
{}